

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mutual_info.c
# Opt level: O0

_Bool allocate(int b,inform_dist **x,inform_dist **y,inform_error *err)

{
  inform_dist *piVar1;
  inform_error *err_local;
  inform_dist **y_local;
  inform_dist **x_local;
  int b_local;
  
  piVar1 = inform_dist_alloc((long)b);
  *x = piVar1;
  if (piVar1 == (inform_dist *)0x0) {
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
    x_local._7_1_ = true;
  }
  else {
    piVar1 = inform_dist_alloc((long)b);
    *y = piVar1;
    if (piVar1 == (inform_dist *)0x0) {
      inform_dist_free(*x);
      if (err != (inform_error *)0x0) {
        *err = INFORM_ENOMEM;
      }
      x_local._7_1_ = true;
    }
    else {
      x_local._7_1_ = false;
    }
  }
  return x_local._7_1_;
}

Assistant:

inline static bool allocate(int const *b, size_t l, inform_dist **joint,
    inform_dist **marginals, inform_error *err)
{
    size_t joint_support = 1;
    for (size_t i = 0; i < l; ++i)
    {
        joint_support *= b[i];
        if ((marginals[i] = inform_dist_alloc(b[i])) == NULL)
        {
            for (size_t j = 0; j < i; ++j)
            {
                inform_dist_free(marginals[j]);
            }
            INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
        }
    }
    if ((*joint = inform_dist_alloc(joint_support)) == NULL)
    {
        for (size_t i = 0; i < l; ++i)
        {
            inform_dist_free(marginals[i]);
        }
        INFORM_ERROR_RETURN(err, INFORM_ENOMEM, true);
    }

    return false;
}